

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  bool bVar1;
  undefined1 uVar2;
  HandlerResponse HVar3;
  uint uVar4;
  ulong uVar5;
  ssize_t sVar6;
  long lVar7;
  byte in_DL;
  Request *in_RSI;
  string *in_R8;
  byte in_R9B;
  string *in_stack_000000d0;
  string *in_stack_000000d8;
  Response *in_stack_000000e0;
  Request *in_stack_000000e8;
  Server *in_stack_000000f0;
  bool ret;
  string *data;
  BufferStream bstrm;
  string s;
  string boundary;
  string content_type;
  char *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  Request *in_stack_fffffffffffffb58;
  Response *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  allocator<char> *in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  Request *in_stack_fffffffffffffb98;
  string *in_stack_fffffffffffffbc0;
  string *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  byte bVar8;
  byte bVar9;
  Request *in_stack_fffffffffffffbd8;
  string *in_stack_fffffffffffffbe0;
  Server *in_stack_fffffffffffffbe8;
  byte local_3f1;
  byte local_3b9;
  bool local_369;
  bool local_359;
  BufferStream local_348;
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [37];
  byte local_2c3;
  byte local_2c2;
  undefined1 local_2c1 [40];
  undefined1 local_299 [40];
  undefined1 local_271 [38];
  byte local_24b;
  byte local_24a;
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [36];
  byte local_cc;
  byte local_cb;
  byte local_ca;
  allocator<char> local_c9;
  string local_c8 [32];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [40];
  string *local_30;
  _Any_data local_19;
  byte local_1;
  
  local_19._M_pod_data[0] = in_DL & 1;
  local_58[0x27] = (string)(in_R9B & 1);
  local_30 = in_R8;
  local_19._1_8_ = in_RSI;
  if (((399 < *(int *)(in_R8 + 1)) &&
      (bVar1 = std::function::operator_cast_to_bool
                         ((function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
                           *)0x226f53), bVar1)) &&
     (HVar3 = detail::std::
              function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
              ::operator()((function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
                            *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                           (Response *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50)
                          ), HVar3 == Handled)) {
    local_58[0x27] = (string)0x1;
  }
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  if (((byte)local_58[0x27] & 1) != 0) {
    apply_ranges(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,
                 in_stack_000000d0);
  }
  local_ca = 0;
  local_cb = 0;
  local_cc = 0;
  local_369 = true;
  if ((local_19._M_pod_data[0] & 1U) == 0) {
    std::allocator<char>::allocator();
    local_ca = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_cb = 1;
    Request::get_header_value
              (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
               (size_t)in_stack_fffffffffffffb80);
    local_cc = 1;
    local_369 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                                in_stack_fffffffffffffb48);
  }
  if ((local_cc & 1) != 0) {
    std::__cxx11::string::~string(local_a8);
  }
  if ((local_cb & 1) != 0) {
    std::__cxx11::string::~string(local_c8);
  }
  if ((local_ca & 1) != 0) {
    std::allocator<char>::~allocator(&local_c9);
  }
  if (local_369 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::allocator<char>::~allocator(&local_141);
    detail::std::__cxx11::to_string((long)in_stack_fffffffffffffb98);
    std::__cxx11::string::operator+=(local_140,local_168);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::operator+=(local_140,", max=");
    detail::std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffb88);
    std::__cxx11::string::operator+=(local_140,local_188);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    Response::set_header
              (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method,
               (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::__cxx11::string::~string(local_140);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    Response::set_header
              (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method,
               (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  uVar5 = std::__cxx11::string::empty();
  local_1f8[0x26] = (string)0x0;
  local_1f8[0x25] = (string)0x0;
  if (((uVar5 & 1) != 0) && (*(long *)(local_30 + 6) == 0)) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                       0x22756a);
    local_3b9 = 0;
    if (!bVar1) goto LAB_00227600;
  }
  std::allocator<char>::allocator();
  local_1f8[0x26] = (string)0x1;
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  local_1f8[0x25] = (string)0x1;
  bVar1 = Response::has_header(in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method);
  local_3b9 = bVar1 ^ 0xff;
LAB_00227600:
  if (((byte)local_1f8[0x25] & 1) != 0) {
    std::__cxx11::string::~string(local_1d0);
  }
  if (((byte)local_1f8[0x26] & 1) != 0) {
    std::allocator<char>::~allocator(&local_1d1);
  }
  if ((local_3b9 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    Response::set_header
              (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method,
               (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
  }
  uVar4 = std::__cxx11::string::empty();
  local_24a = 0;
  local_24b = 0;
  local_3f1 = 0;
  if (((uVar4 & 1) != 0) && (local_3f1 = 0, *(long *)(local_30 + 6) == 0)) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                       0x227866);
    local_3f1 = 0;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_24a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      local_24b = 1;
      bVar1 = Response::has_header(in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method);
      local_3f1 = bVar1 ^ 0xff;
    }
  }
  if ((local_24b & 1) != 0) {
    std::__cxx11::string::~string(local_248);
  }
  if ((local_24a & 1) != 0) {
    std::allocator<char>::~allocator(&local_249);
  }
  if ((local_3f1 & 1) != 0) {
    in_stack_fffffffffffffbe8 = (Server *)local_271;
    in_stack_fffffffffffffbe0 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    in_stack_fffffffffffffbd8 = (Request *)local_299;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    Response::set_header
              (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method,
               (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    std::__cxx11::string::~string((string *)(local_299 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_299);
    std::__cxx11::string::~string((string *)(local_271 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_271);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                          in_stack_fffffffffffffb48);
  local_2c2 = 0;
  local_2c3 = 0;
  bVar8 = 0;
  if (bVar1) {
    in_stack_fffffffffffffbc8 = (string *)local_2c1;
    in_stack_fffffffffffffbc0 = local_30;
    std::allocator<char>::allocator();
    local_2c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    local_2c3 = 1;
    bVar1 = Response::has_header(in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method);
    bVar8 = bVar1 ^ 0xff;
  }
  bVar9 = bVar8;
  if ((local_2c3 & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_2c1 + 1));
  }
  if ((local_2c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_2c1);
  }
  if ((bVar8 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
    Response::set_header
              (in_stack_fffffffffffffb60,&in_stack_fffffffffffffb58->method,
               (string *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator(&local_311);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_httplib::Request_&,_httplib::Response_&)> *)0x227d96);
  if (bVar1) {
    detail::std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              ((function<void_(const_httplib::Request_&,_httplib::Response_&)> *)
               in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (Response *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  }
  detail::BufferStream::BufferStream
            ((BufferStream *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  sVar6 = detail::write_response_line
                    ((Stream *)CONCAT17(bVar9,in_stack_fffffffffffffbd0),
                     (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
  if (sVar6 == 0) {
    local_1 = 0;
    bVar1 = true;
  }
  else {
    lVar7 = detail::std::
            function<long_(httplib::Stream_&,_std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
            ::operator()((function<long_(httplib::Stream_&,_std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
                          *)in_stack_fffffffffffffb60,(Stream *)in_stack_fffffffffffffb58,
                         (unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    if (lVar7 == 0) {
      local_1 = 0;
      bVar1 = true;
    }
    else {
      detail::BufferStream::get_buffer_abi_cxx11_(&local_348);
      std::__cxx11::string::data();
      std::__cxx11::string::size();
      detail::write_data((Stream *)
                         CONCAT17(in_stack_fffffffffffffb6f,
                                  CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                         (char *)in_stack_fffffffffffffb60,(size_t)in_stack_fffffffffffffb58);
      bVar1 = false;
    }
  }
  detail::BufferStream::~BufferStream
            ((BufferStream *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
  if (!bVar1) {
    local_359 = true;
    uVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                            in_stack_fffffffffffffb48);
    if ((bool)uVar2) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        in_stack_fffffffffffffb60 = (Response *)std::__cxx11::string::data();
        std::__cxx11::string::size();
        local_359 = detail::write_data((Stream *)
                                       CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb6e,
                                                               in_stack_fffffffffffffb68)),
                                       (char *)in_stack_fffffffffffffb60,local_19._1_8_);
        in_stack_fffffffffffffb58 = (Request *)local_19._1_8_;
      }
      else {
        bVar1 = std::function::operator_cast_to_bool
                          ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                           0x227fcf);
        if ((bVar1) &&
           (in_stack_fffffffffffffb57 =
                 write_content_with_provider
                           (in_stack_fffffffffffffbe8,(Stream *)in_stack_fffffffffffffbe0,
                            in_stack_fffffffffffffbd8,
                            (Response *)CONCAT17(bVar9,in_stack_fffffffffffffbd0),
                            in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0),
           local_359 = (bool)in_stack_fffffffffffffb57, (bool)in_stack_fffffffffffffb57)) {
          *(undefined1 *)((long)&local_30[8]._M_string_length + 1) = 1;
        }
      }
    }
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)
                       0x22804d);
    if (bVar1) {
      detail::std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                ((function<void_(const_httplib::Request_&,_const_httplib::Response_&)> *)
                 in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                 (Response *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
    }
    local_1 = local_359;
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::string s = "timeout=";
    s += std::to_string(keep_alive_timeout_sec_);
    s += ", max=";
    s += std::to_string(keep_alive_max_count_);
    res.set_header("Keep-Alive", s);
  }

  if ((!res.body.empty() || res.content_length_ > 0 || res.content_provider_) &&
      !res.has_header("Content-Type")) {
    res.set_header("Content-Type", "text/plain");
  }

  if (res.body.empty() && !res.content_length_ && !res.content_provider_ &&
      !res.has_header("Content-Length")) {
    res.set_header("Content-Length", "0");
  }

  if (req.method == "HEAD" && !res.has_header("Accept-Ranges")) {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;
    if (!detail::write_response_line(bstrm, res.status)) { return false; }
    if (!header_writer_(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    detail::write_data(strm, data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!detail::write_data(strm, res.body.data(), res.body.size())) {
        ret = false;
      }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}